

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::doAnalysis(ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
             *this,Func *work)

{
  pointer puVar1;
  _Head_base<0UL,_wasm::Function_*,_false> __args;
  Module *module;
  ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  *pPVar2;
  mapped_type *__args_1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar3;
  undefined1 local_2a8 [8];
  PassRunner runner;
  Func local_58;
  ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  *local_38;
  
  puVar1 = (this->wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  for (puVar3 = (this->wasm->functions).
                super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar2 = local_38, puVar3 != puVar1;
      puVar3 = puVar3 + 1) {
    __args._M_head_impl =
         (puVar3->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
         _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    if (*(char **)((long)&(__args._M_head_impl)->super_Importable + 0x20) != (char *)0x0) {
      runner._232_8_ = __args._M_head_impl;
      __args_1 = std::
                 map<wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_>_>_>
                 ::operator[]((map<wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_>_>_>
                               *)&this->field_0x8,(key_type *)&runner.isNested);
      std::function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)>::
      operator()((function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)>
                  *)work,__args._M_head_impl,__args_1);
    }
  }
  PassRunner::PassRunner((PassRunner *)local_2a8,local_38->wasm);
  module = pPVar2->wasm;
  std::function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)>::function
            ((function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)> *)
             &local_58,
             (function<void_(wasm::Function_*,_wasm::SmallUnorderedSet<wasm::HeapType,_5UL>_&)> *)
             work);
  ParallelFunctionAnalysis<wasm::SmallUnorderedSet<wasm::HeapType,5ul>,(wasm::Mutability)0,wasm::
  ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
  SmallUnorderedSet<wasm::HeapType,5ul>&)>)::Mapper::Mapper(wasm::Module&,std::map<wasm::
  Function*,wasm::SmallUnorderedSet<wasm::HeapType,5ul>,std::less<wasm::Function*>,std::
  allocator<std::pair<wasm::Function*const,wasm::SmallUnorderedSet<wasm::HeapType,5ul>>>>&,std::
  function<void(wasm::Function*,wasm::SmallUnorderedSet<wasm::HeapType_5ul>__>_
            (&runner.isNested,module,(Map *)&this->field_0x8,&local_58);
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)&runner.isNested
             ,(PassRunner *)local_2a8,pPVar2->wasm);
  doAnalysis::Mapper::~Mapper((Mapper *)&runner.isNested);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  PassRunner::~PassRunner((PassRunner *)local_2a8);
  return;
}

Assistant:

void doAnalysis(Func work) {
    // Run on the imports first. TODO: parallelize this too
    for (auto& func : wasm.functions) {
      if (func->imported()) {
        work(func.get(), map[func.get()]);
      }
    }

    struct Mapper : public WalkerPass<PostWalker<Mapper>> {
      bool isFunctionParallel() override { return true; }
      bool modifiesBinaryenIR() override { return Mut; }

      Mapper(Module& module, Map& map, Func work)
        : module(module), map(map), work(work) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Mapper>(module, map, work);
      }

      void doWalkFunction(Function* curr) {
        assert(map.count(curr));
        work(curr, map[curr]);
      }

    private:
      Module& module;
      Map& map;
      Func work;
    };

    PassRunner runner(&wasm);
    Mapper(wasm, map, work).run(&runner, &wasm);
  }